

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O3

void __thiscall chrono::ChIterativeSolverLS::Setup(ChIterativeSolverLS *this)

{
  ChSystemDescriptor *in_RSI;
  
  Setup((ChIterativeSolverLS *)
        &this[-1].m_invdiag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
         .m_rows,in_RSI);
  return;
}

Assistant:

bool ChIterativeSolverLS::Setup(ChSystemDescriptor& sysd) {
    // Calculate problem size
    int dim = sysd.CountActiveVariables() + sysd.CountActiveConstraints();

    // Set up the SPMV wrapper
    m_spmv->Setup(dim, sysd);

    // If needed, evaluate the inverse diagonal entries
    if (m_use_precond) {
        m_invdiag.resize(dim);
        sysd.BuildDiagonalVector(m_invdiag);
        for (int i = 0; i < dim; i++) {
            if (std::abs(m_invdiag(i)) > 1e-9)
                m_invdiag(i) = 1.0 / m_invdiag(i);
            else
                m_invdiag(i) = 1.0;
        }
    }

    // If needed, evaluate the initial guess
    if (m_warm_start) {
        m_initguess.resize(dim);
        sysd.FromUnknownsToVector(m_initguess);
    }

    // Let the concrete solver initialize itself
    bool result = SetupProblem();

    //// ---- DEBUGGING
    ////SaveMatrix(sysd);
    //// ---- DEBUGGING

    return result;
}